

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  uchar **ppuVar1;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *this_00;
  uchar *puVar2;
  vector_brodnik<unsigned_char_*> *pvVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint j;
  long lVar8;
  size_t sVar9;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  undefined8 auStack_230 [64];
  
  this_00 = (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = ((2L << (bucket->_superblock & 0x3f)) -
          ((ulong)bucket->_left_in_superblock * bucket->_block_size + bucket->_left_in_block)) +
          0xffffffc0;
  uVar7 = 0;
  uVar5 = (uint)uVar6;
  if (0x3f < uVar5) {
    uVar7 = 0;
    do {
      lVar8 = 0;
      do {
        puVar2 = vector_brodnik<unsigned_char_*>::operator[](bucket,lVar8 + uVar7);
        auStack_230[lVar8] = puVar2;
        if (puVar2 == (uchar *)0x0) goto LAB_001ac806;
        abStack_270[lVar8] = puVar2[depth];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      lVar8 = 0;
      do {
        pvVar3 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_bucket
                           (this_00,(uint)abStack_270[lVar8]);
        if (pvVar3 == (vector_brodnik<unsigned_char_*> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_brodnik<unsigned char *>]"
                       );
        }
        sVar9 = pvVar3->_left_in_block;
        if (sVar9 == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar3);
          sVar9 = pvVar3->_left_in_block;
        }
        puVar2 = (uchar *)auStack_230[lVar8];
        ppuVar1 = pvVar3->_insertpos;
        pvVar3->_insertpos = ppuVar1 + 1;
        *ppuVar1 = puVar2;
        pvVar3->_left_in_block = sVar9 - 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      uVar7 = uVar7 + 0x40;
    } while (uVar7 < (uVar5 & 0xffffffc0));
  }
  if ((uint)uVar7 < uVar5) {
    sVar9 = uVar7 & 0xffffffff;
    do {
      puVar2 = vector_brodnik<unsigned_char_*>::operator[](bucket,sVar9);
      if (puVar2 == (uchar *)0x0) {
LAB_001ac806:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      pvVar3 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_bucket
                         (this_00,(uint)puVar2[depth]);
      if (pvVar3 == (vector_brodnik<unsigned_char_*> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_brodnik<unsigned char *>]"
                     );
      }
      sVar4 = pvVar3->_left_in_block;
      if (sVar4 == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar3);
        sVar4 = pvVar3->_left_in_block;
      }
      ppuVar1 = pvVar3->_insertpos;
      pvVar3->_insertpos = ppuVar1 + 1;
      *ppuVar1 = puVar2;
      pvVar3->_left_in_block = sVar4 - 1;
      sVar9 = sVar9 + 1;
    } while (sVar9 < (uVar6 & 0xffffffff));
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}